

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O2

error<idx2::err_code> idx2::WriteVolume(cstr FileName,volume *Vol,extent *Ext)

{
  u64 uVar1;
  u64 uVar2;
  byte *pbVar3;
  long lVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  byte *pbVar9;
  undefined8 uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  byte *pbVar14;
  int iVar15;
  long *in_FS_OFFSET;
  error<idx2::err_code> eVar16;
  int local_64;
  int local_50;
  FILE *Fp;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_Volume_cpp:104:3)>
  __ScopeGuard__104;
  
  Fp = (FILE *)fopen(FileName,"wb");
  __ScopeGuard__104.Func.Fp = &Fp;
  __ScopeGuard__104.Dismissed = false;
  switch(Vol->Type) {
  case int8:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar6 = (long)(uVar1 * 2) >> 0x2b;
    lVar7 = Vol->Dims << 0x2b;
    lVar8 = lVar7 >> 0x2b;
    lVar11 = Vol->Dims << 0x16;
    lVar12 = (lVar11 >> 0x2b) * lVar8;
    pbVar3 = (Vol->Buffer).Data;
    lVar4 = ((long)(uVar1 << 0x2b) >> 0x2b) + ((long)(uVar1 << 0x16) >> 0x2b) * lVar8;
    local_64 = 0;
    pbVar14 = pbVar3 + lVar12 * lVar6 + lVar4;
    do {
      pbVar9 = pbVar14 + (lVar8 - ((long)(uVar2 << 0x2b) >> 0x2b));
      iVar15 = 0;
      do {
        if (pbVar14 == pbVar3 + (((long)(uVar2 * 2) >> 0x2b) + lVar6) * lVar12 + lVar4)
        goto switchD_0017c576_default;
        sVar5 = fwrite(pbVar14,1,1,(FILE *)Fp);
        if (sVar5 != 1) goto LAB_0017d1d4;
        iVar15 = iVar15 + 1;
        pbVar14 = pbVar14 + 1;
        pbVar9 = pbVar9 + 1;
      } while (iVar15 < (int)((long)(uVar2 << 0x2b) >> 0x2b));
      local_64 = local_64 + 1;
      local_50 = (int)((long)(uVar2 << 0x16) >> 0x2b);
      pbVar14 = pbVar9;
      if (local_50 <= local_64) {
        local_64 = 0;
        pbVar14 = pbVar9 + ((long)((int)(lVar11 >> 0x2b) * (int)(lVar7 >> 0x2b)) -
                           ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) * (lVar7 >> 0xb))
                           >> 0x20));
      }
    } while( true );
  case uint8:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar6 = (long)(uVar1 * 2) >> 0x2b;
    lVar7 = Vol->Dims << 0x2b;
    lVar8 = lVar7 >> 0x2b;
    lVar11 = Vol->Dims << 0x16;
    lVar12 = (lVar11 >> 0x2b) * lVar8;
    pbVar3 = (Vol->Buffer).Data;
    lVar4 = ((long)(uVar1 << 0x2b) >> 0x2b) + ((long)(uVar1 << 0x16) >> 0x2b) * lVar8;
    local_64 = 0;
    pbVar14 = pbVar3 + lVar12 * lVar6 + lVar4;
    do {
      pbVar9 = pbVar14 + (lVar8 - ((long)(uVar2 << 0x2b) >> 0x2b));
      iVar15 = 0;
      do {
        if (pbVar14 == pbVar3 + (((long)(uVar2 * 2) >> 0x2b) + lVar6) * lVar12 + lVar4)
        goto switchD_0017c576_default;
        sVar5 = fwrite(pbVar14,1,1,(FILE *)Fp);
        if (sVar5 != 1) goto LAB_0017d1d4;
        iVar15 = iVar15 + 1;
        pbVar14 = pbVar14 + 1;
        pbVar9 = pbVar9 + 1;
      } while (iVar15 < (int)((long)(uVar2 << 0x2b) >> 0x2b));
      local_64 = local_64 + 1;
      local_50 = (int)((long)(uVar2 << 0x16) >> 0x2b);
      pbVar14 = pbVar9;
      if (local_50 <= local_64) {
        local_64 = 0;
        pbVar14 = pbVar9 + ((long)((int)(lVar11 >> 0x2b) * (int)(lVar7 >> 0x2b)) -
                           ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) * (lVar7 >> 0xb))
                           >> 0x20));
      }
    } while( true );
  case int16:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar4 = (long)(uVar1 << 0x2b) >> 0x2b;
    lVar6 = (long)(uVar1 * 2) >> 0x2b;
    pbVar3 = (Vol->Buffer).Data;
    lVar11 = Vol->Dims << 0x2b;
    lVar8 = lVar11 >> 0x2b;
    lVar12 = Vol->Dims << 0x16;
    lVar13 = (lVar12 >> 0x2b) * lVar8;
    lVar7 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar8;
    local_64 = 0;
    pbVar14 = pbVar3 + lVar4 * 2 + lVar7 * 2 + lVar13 * lVar6 * 2;
    do {
      pbVar9 = pbVar14 + lVar8 * 2 + ((long)(uVar2 << 0x2b) >> 0x2b) * -2;
      iVar15 = 0;
      do {
        if (pbVar14 ==
            pbVar3 + lVar4 * 2 + lVar7 * 2 + (((long)(uVar2 * 2) >> 0x2b) + lVar6) * lVar13 * 2)
        goto switchD_0017c576_default;
        sVar5 = fwrite(pbVar14,2,1,(FILE *)Fp);
        if (sVar5 != 1) goto LAB_0017d1d4;
        iVar15 = iVar15 + 1;
        pbVar14 = pbVar14 + 2;
        pbVar9 = pbVar9 + 2;
      } while (iVar15 < (int)((long)(uVar2 << 0x2b) >> 0x2b));
      local_64 = local_64 + 1;
      local_50 = (int)((long)(uVar2 << 0x16) >> 0x2b);
      pbVar14 = pbVar9;
      if (local_50 <= local_64) {
        local_64 = 0;
        pbVar14 = pbVar9 + ((long)((int)(lVar12 >> 0x2b) * (int)(lVar11 >> 0x2b)) * 2 -
                           ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) * (lVar11 >> 0xb)
                                  ) >> 0x1f));
      }
    } while( true );
  case uint16:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar4 = (long)(uVar1 << 0x2b) >> 0x2b;
    lVar6 = (long)(uVar1 * 2) >> 0x2b;
    pbVar3 = (Vol->Buffer).Data;
    lVar11 = Vol->Dims << 0x2b;
    lVar8 = lVar11 >> 0x2b;
    lVar12 = Vol->Dims << 0x16;
    lVar13 = (lVar12 >> 0x2b) * lVar8;
    lVar7 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar8;
    local_64 = 0;
    pbVar14 = pbVar3 + lVar4 * 2 + lVar7 * 2 + lVar13 * lVar6 * 2;
    do {
      pbVar9 = pbVar14 + lVar8 * 2 + ((long)(uVar2 << 0x2b) >> 0x2b) * -2;
      iVar15 = 0;
      do {
        if (pbVar14 ==
            pbVar3 + lVar4 * 2 + lVar7 * 2 + (((long)(uVar2 * 2) >> 0x2b) + lVar6) * lVar13 * 2)
        goto switchD_0017c576_default;
        sVar5 = fwrite(pbVar14,2,1,(FILE *)Fp);
        if (sVar5 != 1) goto LAB_0017d1d4;
        iVar15 = iVar15 + 1;
        pbVar14 = pbVar14 + 2;
        pbVar9 = pbVar9 + 2;
      } while (iVar15 < (int)((long)(uVar2 << 0x2b) >> 0x2b));
      local_64 = local_64 + 1;
      local_50 = (int)((long)(uVar2 << 0x16) >> 0x2b);
      pbVar14 = pbVar9;
      if (local_50 <= local_64) {
        local_64 = 0;
        pbVar14 = pbVar9 + ((long)((int)(lVar12 >> 0x2b) * (int)(lVar11 >> 0x2b)) * 2 -
                           ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) * (lVar11 >> 0xb)
                                  ) >> 0x1f));
      }
    } while( true );
  case int32:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar4 = (long)(uVar1 << 0x2b) >> 0x2b;
    lVar6 = (long)(uVar1 * 2) >> 0x2b;
    pbVar3 = (Vol->Buffer).Data;
    lVar11 = Vol->Dims << 0x2b;
    lVar8 = lVar11 >> 0x2b;
    lVar12 = Vol->Dims << 0x16;
    lVar13 = (lVar12 >> 0x2b) * lVar8;
    lVar7 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar8;
    local_64 = 0;
    pbVar14 = pbVar3 + lVar4 * 4 + lVar7 * 4 + lVar13 * lVar6 * 4;
    do {
      pbVar9 = pbVar14 + lVar8 * 4 + ((long)(uVar2 << 0x2b) >> 0x2b) * -4;
      iVar15 = 0;
      do {
        if (pbVar14 ==
            pbVar3 + lVar4 * 4 + lVar7 * 4 + (((long)(uVar2 * 2) >> 0x2b) + lVar6) * lVar13 * 4)
        goto switchD_0017c576_default;
        sVar5 = fwrite(pbVar14,4,1,(FILE *)Fp);
        if (sVar5 != 1) goto LAB_0017d1d4;
        iVar15 = iVar15 + 1;
        pbVar14 = pbVar14 + 4;
        pbVar9 = pbVar9 + 4;
      } while (iVar15 < (int)((long)(uVar2 << 0x2b) >> 0x2b));
      local_64 = local_64 + 1;
      local_50 = (int)((long)(uVar2 << 0x16) >> 0x2b);
      pbVar14 = pbVar9;
      if (local_50 <= local_64) {
        local_64 = 0;
        pbVar14 = pbVar9 + ((long)((int)(lVar12 >> 0x2b) * (int)(lVar11 >> 0x2b)) * 4 -
                           ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) * (lVar11 >> 0xb)
                                  ) >> 0x1e));
      }
    } while( true );
  case uint32:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar4 = (long)(uVar1 << 0x2b) >> 0x2b;
    lVar6 = (long)(uVar1 * 2) >> 0x2b;
    pbVar3 = (Vol->Buffer).Data;
    lVar11 = Vol->Dims << 0x2b;
    lVar8 = lVar11 >> 0x2b;
    lVar12 = Vol->Dims << 0x16;
    lVar13 = (lVar12 >> 0x2b) * lVar8;
    lVar7 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar8;
    local_64 = 0;
    pbVar14 = pbVar3 + lVar4 * 4 + lVar7 * 4 + lVar13 * lVar6 * 4;
    do {
      pbVar9 = pbVar14 + lVar8 * 4 + ((long)(uVar2 << 0x2b) >> 0x2b) * -4;
      iVar15 = 0;
      do {
        if (pbVar14 ==
            pbVar3 + lVar4 * 4 + lVar7 * 4 + (((long)(uVar2 * 2) >> 0x2b) + lVar6) * lVar13 * 4)
        goto switchD_0017c576_default;
        sVar5 = fwrite(pbVar14,4,1,(FILE *)Fp);
        if (sVar5 != 1) goto LAB_0017d1d4;
        iVar15 = iVar15 + 1;
        pbVar14 = pbVar14 + 4;
        pbVar9 = pbVar9 + 4;
      } while (iVar15 < (int)((long)(uVar2 << 0x2b) >> 0x2b));
      local_64 = local_64 + 1;
      local_50 = (int)((long)(uVar2 << 0x16) >> 0x2b);
      pbVar14 = pbVar9;
      if (local_50 <= local_64) {
        local_64 = 0;
        pbVar14 = pbVar9 + ((long)((int)(lVar12 >> 0x2b) * (int)(lVar11 >> 0x2b)) * 4 -
                           ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) * (lVar11 >> 0xb)
                                  ) >> 0x1e));
      }
    } while( true );
  case int64:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar4 = (long)(uVar1 << 0x2b) >> 0x2b;
    lVar6 = (long)(uVar1 * 2) >> 0x2b;
    pbVar3 = (Vol->Buffer).Data;
    lVar11 = Vol->Dims << 0x2b;
    lVar8 = lVar11 >> 0x2b;
    lVar12 = Vol->Dims << 0x16;
    lVar13 = (lVar12 >> 0x2b) * lVar8;
    lVar7 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar8;
    local_64 = 0;
    pbVar14 = pbVar3 + lVar4 * 8 + lVar7 * 8 + lVar13 * lVar6 * 8;
    do {
      pbVar9 = pbVar14 + lVar8 * 8 + ((long)(uVar2 << 0x2b) >> 0x2b) * -8;
      iVar15 = 0;
      do {
        if (pbVar14 ==
            pbVar3 + lVar4 * 8 + lVar7 * 8 + (((long)(uVar2 * 2) >> 0x2b) + lVar6) * lVar13 * 8)
        goto switchD_0017c576_default;
        sVar5 = fwrite(pbVar14,8,1,(FILE *)Fp);
        if (sVar5 != 1) goto LAB_0017d1d4;
        iVar15 = iVar15 + 1;
        pbVar14 = pbVar14 + 8;
        pbVar9 = pbVar9 + 8;
      } while (iVar15 < (int)((long)(uVar2 << 0x2b) >> 0x2b));
      local_64 = local_64 + 1;
      local_50 = (int)((long)(uVar2 << 0x16) >> 0x2b);
      pbVar14 = pbVar9;
      if (local_50 <= local_64) {
        local_64 = 0;
        pbVar14 = pbVar9 + ((long)((int)(lVar12 >> 0x2b) * (int)(lVar11 >> 0x2b)) * 8 -
                           ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) * (lVar11 >> 0xb)
                                  ) >> 0x1d));
      }
    } while( true );
  case uint64:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar4 = (long)(uVar1 << 0x2b) >> 0x2b;
    lVar6 = (long)(uVar1 * 2) >> 0x2b;
    pbVar3 = (Vol->Buffer).Data;
    lVar11 = Vol->Dims << 0x2b;
    lVar8 = lVar11 >> 0x2b;
    lVar12 = Vol->Dims << 0x16;
    lVar13 = (lVar12 >> 0x2b) * lVar8;
    lVar7 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar8;
    local_64 = 0;
    pbVar14 = pbVar3 + lVar4 * 8 + lVar7 * 8 + lVar13 * lVar6 * 8;
    do {
      pbVar9 = pbVar14 + lVar8 * 8 + ((long)(uVar2 << 0x2b) >> 0x2b) * -8;
      iVar15 = 0;
      do {
        if (pbVar14 ==
            pbVar3 + lVar4 * 8 + lVar7 * 8 + (((long)(uVar2 * 2) >> 0x2b) + lVar6) * lVar13 * 8)
        goto switchD_0017c576_default;
        sVar5 = fwrite(pbVar14,8,1,(FILE *)Fp);
        if (sVar5 != 1) goto LAB_0017d1d4;
        iVar15 = iVar15 + 1;
        pbVar14 = pbVar14 + 8;
        pbVar9 = pbVar9 + 8;
      } while (iVar15 < (int)((long)(uVar2 << 0x2b) >> 0x2b));
      local_64 = local_64 + 1;
      local_50 = (int)((long)(uVar2 << 0x16) >> 0x2b);
      pbVar14 = pbVar9;
      if (local_50 <= local_64) {
        local_64 = 0;
        pbVar14 = pbVar9 + ((long)((int)(lVar12 >> 0x2b) * (int)(lVar11 >> 0x2b)) * 8 -
                           ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) * (lVar11 >> 0xb)
                                  ) >> 0x1d));
      }
    } while( true );
  case float32:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar4 = (long)(uVar1 << 0x2b) >> 0x2b;
    lVar6 = (long)(uVar1 * 2) >> 0x2b;
    pbVar3 = (Vol->Buffer).Data;
    lVar11 = Vol->Dims << 0x2b;
    lVar8 = lVar11 >> 0x2b;
    lVar12 = Vol->Dims << 0x16;
    lVar13 = (lVar12 >> 0x2b) * lVar8;
    lVar7 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar8;
    local_64 = 0;
    pbVar14 = pbVar3 + lVar4 * 4 + lVar7 * 4 + lVar13 * lVar6 * 4;
    do {
      pbVar9 = pbVar14 + lVar8 * 4 + ((long)(uVar2 << 0x2b) >> 0x2b) * -4;
      iVar15 = 0;
      do {
        if (pbVar14 ==
            pbVar3 + lVar4 * 4 + lVar7 * 4 + (((long)(uVar2 * 2) >> 0x2b) + lVar6) * lVar13 * 4)
        goto switchD_0017c576_default;
        sVar5 = fwrite(pbVar14,4,1,(FILE *)Fp);
        if (sVar5 != 1) goto LAB_0017d1d4;
        iVar15 = iVar15 + 1;
        pbVar14 = pbVar14 + 4;
        pbVar9 = pbVar9 + 4;
      } while (iVar15 < (int)((long)(uVar2 << 0x2b) >> 0x2b));
      local_64 = local_64 + 1;
      local_50 = (int)((long)(uVar2 << 0x16) >> 0x2b);
      pbVar14 = pbVar9;
      if (local_50 <= local_64) {
        local_64 = 0;
        pbVar14 = pbVar9 + ((long)((int)(lVar12 >> 0x2b) * (int)(lVar11 >> 0x2b)) * 4 -
                           ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) * (lVar11 >> 0xb)
                                  ) >> 0x1e));
      }
    } while( true );
  case float64:
    uVar1 = Ext->From;
    uVar2 = Ext->Dims;
    lVar4 = (long)(uVar1 << 0x2b) >> 0x2b;
    lVar6 = (long)(uVar1 * 2) >> 0x2b;
    pbVar3 = (Vol->Buffer).Data;
    lVar11 = Vol->Dims << 0x2b;
    lVar8 = lVar11 >> 0x2b;
    lVar12 = Vol->Dims << 0x16;
    lVar13 = (lVar12 >> 0x2b) * lVar8;
    lVar7 = ((long)(uVar1 << 0x16) >> 0x2b) * lVar8;
    local_64 = 0;
    pbVar14 = pbVar3 + lVar4 * 8 + lVar7 * 8 + lVar13 * lVar6 * 8;
    do {
      pbVar9 = pbVar14 + lVar8 * 8 + ((long)(uVar2 << 0x2b) >> 0x2b) * -8;
      iVar15 = 0;
      do {
        if (pbVar14 ==
            pbVar3 + lVar4 * 8 + lVar7 * 8 + (((long)(uVar2 * 2) >> 0x2b) + lVar6) * lVar13 * 8)
        goto switchD_0017c576_default;
        sVar5 = fwrite(pbVar14,8,1,(FILE *)Fp);
        if (sVar5 != 1) goto LAB_0017d1d4;
        iVar15 = iVar15 + 1;
        pbVar14 = pbVar14 + 8;
        pbVar9 = pbVar9 + 8;
      } while (iVar15 < (int)((long)(uVar2 << 0x2b) >> 0x2b));
      local_64 = local_64 + 1;
      local_50 = (int)((long)(uVar2 << 0x16) >> 0x2b);
      pbVar14 = pbVar9;
      if (local_50 <= local_64) {
        local_64 = 0;
        pbVar14 = pbVar9 + ((long)((int)(lVar12 >> 0x2b) * (int)(lVar11 >> 0x2b)) * 8 -
                           ((long)(((ulong)((long)(uVar2 << 0x16) >> 0xb) >> 0x20) * (lVar11 >> 0xb)
                                  ) >> 0x1d));
      }
    } while( true );
  default:
switchD_0017c576_default:
    uVar10 = 0;
  }
LAB_0017d1d7:
  *(char **)(*in_FS_OFFSET + -0x400) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Volume.cpp"
  ;
  *(undefined4 *)(*in_FS_OFFSET + -0x200) = 0x70;
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Volume.cpp:104:3)>
  ::~scope_guard(&__ScopeGuard__104);
  eVar16.Code = (int)uVar10;
  eVar16.StackIdx = (char)((ulong)uVar10 >> 0x20);
  eVar16.StrGened = (bool)(char)((ulong)uVar10 >> 0x28);
  eVar16._14_2_ = (short)((ulong)uVar10 >> 0x30);
  eVar16.Msg = "";
  return eVar16;
LAB_0017d1d4:
  uVar10 = 0xc;
  goto LAB_0017d1d7;
}

Assistant:

error<>
WriteVolume(cstr FileName, const volume& Vol, const extent& Ext)
{
  FILE* Fp = fopen(FileName, "wb");
  idx2_CleanUp(fclose(Fp));
#define Body(type)                                                                                 \
  auto EndIt = End<type>(Ext, Vol);                                                                \
  for (auto It = Begin<type>(Ext, Vol); It != EndIt; ++It)                                         \
  {                                                                                                \
    if (fwrite(&(*It), sizeof(*It), 1, Fp) != 1)                                                   \
      return idx2_Error(err_code::FileWriteFailed);                                                \
  }
  idx2_DispatchOnType(Vol.Type) return idx2_Error(err_code::NoError);
#undef Body
}